

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<mp::CallExpr>::Matcher(Matcher<mp::CallExpr> *this,CallExpr value)

{
  MatcherBase<mp::CallExpr> local_30;
  BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41> local_18;
  
  (this->super_MatcherBase<mp::CallExpr>).impl_.value_ = (MatcherInterface<mp::CallExpr> *)0x0;
  (this->super_MatcherBase<mp::CallExpr>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::CallExpr>).impl_.link_;
  (this->super_MatcherBase<mp::CallExpr>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001c9b00;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::CallExpr> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<mp::CallExpr>_>::operator=
            (&(this->super_MatcherBase<mp::CallExpr>).impl_,&local_30.impl_);
  internal::MatcherBase<mp::CallExpr>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }